

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O2

void dFillRHS(trans_t trans,int nrhs,double *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char transc [1];
  
  sp_dgemm(transc,"N",A->nrow,nrhs,A->ncol,1.0,A,x,ldx,0.0,*(double **)((long)B->Store + 8),
           *B->Store);
  return;
}

Assistant:

void
dFillRHS(trans_t trans, int nrhs, double *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    double   *rhs;
    double one = 1.0;
    double zero = 0.0;
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (double *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_dgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}